

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O2

void Vec_QueClear(Vec_Que_t *p)

{
  int *piVar1;
  uint __line;
  ulong uVar2;
  long lVar3;
  char *__assertion;
  
  piVar1 = p->pHeap;
  if (*piVar1 == -1) {
    uVar2 = 1;
    while( true ) {
      if ((long)p->nSize <= (long)uVar2) {
        p->nSize = 1;
        return;
      }
      lVar3 = (long)piVar1[uVar2];
      if ((lVar3 < 0) || (uVar2 != (uint)p->pOrder[lVar3])) break;
      p->pOrder[lVar3] = -1;
      piVar1[uVar2] = -1;
      uVar2 = uVar2 + 1;
    }
    __assertion = "p->pHeap[i] >= 0 && p->pOrder[p->pHeap[i]] == i";
    __line = 0x74;
  }
  else {
    __assertion = "p->pHeap[0] == -1";
    __line = 0x71;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                ,__line,"void Vec_QueClear(Vec_Que_t *)");
}

Assistant:

static inline void Vec_QueClear( Vec_Que_t * p )
{
    int i;
    assert( p->pHeap[0] == -1 );
    for ( i = 1; i < p->nSize; i++ )
    {
        assert( p->pHeap[i] >= 0 && p->pOrder[p->pHeap[i]] == i );
        p->pOrder[p->pHeap[i]] = -1;
        p->pHeap[i] = -1;
    }
    p->nSize = 1;
}